

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

void Scl_Init(Abc_Frame_t *pAbc)

{
  Cmd_CommandAdd(pAbc,"SCL mapping","read_lib",Scl_CommandReadLib,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","write_lib",Scl_CommandWriteLib,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","print_lib",Scl_CommandPrintLib,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","leak2area",Scl_CommandLeak2Area,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","read_scl",Scl_CommandReadScl,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","write_scl",Scl_CommandWriteScl,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","dump_genlib",Scl_CommandDumpGen,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","print_gs",Scl_CommandPrintGS,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","stime",Scl_CommandStime,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","topo",Scl_CommandTopo,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","unbuffer",Scl_CommandUnBuffer,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","buffer",Scl_CommandBuffer,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","minsize",Scl_CommandMinsize,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","maxsize",Scl_CommandMaxsize,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","upsize",Scl_CommandUpsize,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","dnsize",Scl_CommandDnsize,1);
  Cmd_CommandAdd(pAbc,"SCL mapping","print_buf",Scl_CommandPrintBuf,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","read_constr",Scl_CommandReadConstr,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","write_constr",Scl_CommandWriteConstr,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","print_constr",Scl_CommandPrintConstr,0);
  Cmd_CommandAdd(pAbc,"SCL mapping","reset_constr",Scl_CommandResetConstr,0);
  return;
}

Assistant:

void Scl_Init( Abc_Frame_t * pAbc )
{
    Cmd_CommandAdd( pAbc, "SCL mapping",  "read_lib",      Scl_CommandReadLib,     0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "write_lib",     Scl_CommandWriteLib,    0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "print_lib",     Scl_CommandPrintLib,    0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "leak2area",     Scl_CommandLeak2Area,   0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "read_scl",      Scl_CommandReadScl,     0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "write_scl",     Scl_CommandWriteScl,    0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "dump_genlib",   Scl_CommandDumpGen,     0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "print_gs",      Scl_CommandPrintGS,     0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "stime",         Scl_CommandStime,       0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "topo",          Scl_CommandTopo,        1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "unbuffer",      Scl_CommandUnBuffer,    1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "buffer",        Scl_CommandBuffer,      1 ); 
//    Cmd_CommandAdd( pAbc, "SCL mapping",  "_buffer",       Scl_CommandBufferOld,   1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "minsize",       Scl_CommandMinsize,     1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "maxsize",       Scl_CommandMaxsize,     1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "upsize",        Scl_CommandUpsize,      1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "dnsize",        Scl_CommandDnsize,      1 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "print_buf",     Scl_CommandPrintBuf,    0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "read_constr",   Scl_CommandReadConstr,  0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "write_constr",  Scl_CommandWriteConstr, 0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "print_constr",  Scl_CommandPrintConstr, 0 ); 
    Cmd_CommandAdd( pAbc, "SCL mapping",  "reset_constr",  Scl_CommandResetConstr, 0 ); 
}